

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O1

void __thiscall
logUnits_dBNeperConversions_Test::~logUnits_dBNeperConversions_Test
          (logUnits_dBNeperConversions_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(logUnits, dBNeperConversions)
{
    EXPECT_EQ(convert(1.0, precise::log::bel, precise::log::dB), 10.0);
    EXPECT_NEAR(
        convert(1.0, precise::log::bel, precise::log::neper),
        1.1512925465,
        test::tolerance);
    EXPECT_NEAR(
        convert(10.0, precise::log::dB, precise::log::neper),
        1.1512925465,
        test::tolerance);

    EXPECT_NEAR(
        convert(
            10.0,
            precise::log::dB * precise::V,
            precise::log::neper * precise::V),
        1.1512925465,
        test::tolerance);
    EXPECT_NEAR(
        convert(
            10.0,
            precise::log::dB * precise::W,
            precise::log::neper * precise::W),
        1.1512925465,
        test::tolerance);

    EXPECT_NEAR(
        convert(
            10.0,
            precise::log::dB * precise::V,
            precise::log::neperA * precise::V),
        1.1512925465,
        test::tolerance);
    EXPECT_NEAR(
        convert(
            10.0,
            precise::log::dB * precise::W,
            precise::log::neperP * precise::W),
        1.1512925465,
        test::tolerance);

    EXPECT_NEAR(
        convert(
            1.1512925465,
            precise::log::neper * precise::V,
            precise::log::dB * precise::V),
        10.0,
        test::tolerance);
    EXPECT_NEAR(
        convert(
            1.1512925465,
            precise::log::neper * precise::W,
            precise::log::dB * precise::W),
        10.0,
        test::tolerance);

    EXPECT_NEAR(
        convert(
            1.1512925465,
            precise::log::neperA * precise::V,
            precise::log::dB * precise::V),
        10.0,
        test::tolerance);
    EXPECT_NEAR(
        convert(
            1.1512925465,
            precise::log::neperP * precise::W,
            precise::log::dB * precise::W),
        10.0,
        test::tolerance);

    EXPECT_EQ(convert(10.0, precise::log::bel, precise::log::dB), 100.0);
    EXPECT_NEAR(
        convert(10.0, precise::log::bel, precise::log::neper),
        11.512925465,
        test::tolerance);
    EXPECT_NEAR(
        convert(100.0, precise::log::dB, precise::log::neper),
        11.512925465,
        test::tolerance);

    EXPECT_NEAR(
        convert(2.0, precise::log::dB, precise::log::neper),
        0.2302585093,
        test::tolerance);

    EXPECT_NEAR(
        convert(5.0, precise::log::neper, precise::log::dB),
        43.4294481903,
        test::tolerance);
    EXPECT_NEAR(
        convert(5.0, precise::log::neper, precise::log::bel),
        4.342944819,
        test::tolerance);
}